

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.c
# Opt level: O0

int gladLoaderLoadGL(void)

{
  GLADglprocaddrfunc local_28;
  _glad_gl_userptr userptr;
  void *handle;
  int version;
  
  handle._4_4_ = 0;
  local_28 = (GLADglprocaddrfunc)glad_get_dlopen_handle(gladLoaderLoadGL::NAMES,2);
  if (local_28 != (GLADglprocaddrfunc)0x0) {
    userptr.gl_get_proc_address_ptr = local_28;
    userptr.gl_handle = glad_dlsym_handle(local_28,"glXGetProcAddressARB");
    handle._4_4_ = gladLoadGLUserPtr(glad_gl_get_proc,&local_28);
    glad_close_dlopen_handle(userptr.gl_get_proc_address_ptr);
  }
  return handle._4_4_;
}

Assistant:

int gladLoaderLoadGL(void) {
#ifdef __APPLE__
    static const char *NAMES[] = {
        "../Frameworks/OpenGL.framework/OpenGL",
        "/Library/Frameworks/OpenGL.framework/OpenGL",
        "/System/Library/Frameworks/OpenGL.framework/OpenGL",
        "/System/Library/Frameworks/OpenGL.framework/Versions/Current/OpenGL"
    };
#elif GLAD_PLATFORM_WIN32
    static const char *NAMES[] = {"opengl32.dll"};
#else
    static const char *NAMES[] = {
#if defined __CYGWIN__
        "libGL-1.so",
#endif
        "libGL.so.1",
        "libGL.so"
    };
#endif

    int version = 0;
    void *handle;
    struct _glad_gl_userptr userptr;

    handle = glad_get_dlopen_handle(NAMES, sizeof(NAMES) / sizeof(NAMES[0]));
    if (handle) {
        userptr.gl_handle = handle;
#ifdef __APPLE__
        userptr.gl_get_proc_address_ptr = NULL;
#elif GLAD_PLATFORM_WIN32
        userptr.gl_get_proc_address_ptr =
            (GLADglprocaddrfunc) glad_dlsym_handle(handle, "wglGetProcAddress");
#else
        userptr.gl_get_proc_address_ptr =
            (GLADglprocaddrfunc) glad_dlsym_handle(handle, "glXGetProcAddressARB");
#endif
        version = gladLoadGLUserPtr(glad_gl_get_proc, &userptr);

        glad_close_dlopen_handle(handle);
    }

    return version;
}